

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_client.c
# Opt level: O0

QcMessage * qc_client_msgget(QcClient *client,char *qname,int msec,QcErr *err)

{
  QcSocket *socket_00;
  int iVar1;
  char *recvbuf;
  QcMessage *pQVar2;
  QcMessage *message;
  int buff_len;
  char *buff;
  int local_86;
  QcPrtclReply prtclReply;
  QcPrtclMsgGet prtclMsgGet;
  QcPrtclHead prtclHead;
  QcSocket *socket;
  int ret;
  QcErr *err_local;
  int msec_local;
  char *qname_local;
  QcClient *client_local;
  
  socket_00 = client->socket;
  memset(prtclMsgGet.qname + 0x1c,0,0x1e);
  prtclMsgGet.qname[0x1c] = '\x03';
  prtclMsgGet.qname[0x1d] = -0x27;
  prtclMsgGet.qname[0x1e] = '\x01';
  prtclMsgGet.qname[0x1f] = '\0';
  prtclMsgGet.wait_msec._0_2_ = 0x79;
  stack0xffffffffffffffa8 = 0;
  prtclMsgGet.qname._24_4_ = msec;
  strcpy((char *)&prtclReply,qname);
  qc_prtcl_head_hton((QcPrtclHead *)(prtclMsgGet.qname + 0x1c));
  iVar1 = qc_tcp_send(socket_00,prtclMsgGet.qname + 0x1c,0x1e);
  if (iVar1 == 0x1e) {
    qc_prtcl_msgget_hton((QcPrtclMsgGet *)&prtclReply);
    iVar1 = qc_tcp_send(socket_00,(char *)&prtclReply,0x24);
    if (iVar1 == 0x24) {
      iVar1 = qc_tcp_recvall(socket_00,prtclMsgGet.qname + 0x1c,0x1e);
      if (iVar1 < 1) {
        qc_seterr(err,0x1e,"tcp recv head failed.");
      }
      else {
        qc_prtcl_head_ntoh((QcPrtclHead *)(prtclMsgGet.qname + 0x1c));
        iVar1 = qc_tcp_recvall(socket_00,(char *)((long)&buff + 6),8);
        if (iVar1 < 1) {
          qc_seterr(err,0x1e,"tcp recv relpy failed.");
        }
        else {
          qc_prtcl_reply_ntoh((QcPrtclReply *)((long)&buff + 6));
          if (stack0xffffffffffffff76 == 0) {
            recvbuf = (char *)malloc((ulong)(local_86 + 1));
            if (recvbuf == (char *)0x0) {
              fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_net/qc_client.c"
                      ,0xbb);
              __assert_fail("buff",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_net/qc_client.c"
                            ,0xbb,
                            "QcMessage *qc_client_msgget(QcClient *, const char *, int, QcErr *)");
            }
            memset(recvbuf,0,(ulong)(local_86 + 1));
            iVar1 = qc_tcp_recvall(socket_00,recvbuf,local_86);
            if (0 < iVar1) {
              pQVar2 = qc_message_create(recvbuf,local_86,0);
              return pQVar2;
            }
            qc_seterr(err,0x1e,"tcp recv buff failed.");
          }
          else if (stack0xffffffffffffff76 == 100) {
            qc_seterr(err,0x34,"time out");
          }
          else {
            qc_seterr(err,99,"unkown failed");
          }
        }
      }
    }
    else {
      qc_seterr(err,0x1e,"tcp send body failed.");
    }
  }
  else {
    qc_seterr(err,0x1e,"tcp send head failed.");
  }
  return (QcMessage *)0x0;
}

Assistant:

QcMessage* qc_client_msgget(QcClient *client, const char *qname, int msec, QcErr *err)
{
	int ret;
	QcSocket *socket = client->socket;

	QcPrtclHead prtclHead;
	memset(&prtclHead, 0, sizeof(QcPrtclHead));
	prtclHead.protocol = QC_PROTOCOL_MQ;
	prtclHead.version = QC_PROTOCOL_VERSION;
	prtclHead.type = QC_TYPE_MSGGET;
	prtclHead.packsn = 0;

	QcPrtclMsgGet prtclMsgGet;
	prtclMsgGet.wait_msec = msec;
	strcpy(prtclMsgGet.qname, qname);

	prtclHead.body_len = sizeof(QcPrtclMsgGet);

	qc_prtcl_head_hton(&prtclHead);
	ret = qc_tcp_send(socket, (char*)&prtclHead, sizeof(QcPrtclHead));
	if (ret != sizeof(QcPrtclHead)){
		qc_seterr(err, QC_ERR_SOCKET, "tcp send head failed.");
		goto failed;
	}

	qc_prtcl_msgget_hton(&prtclMsgGet);
	ret = qc_tcp_send(socket, (char*)&prtclMsgGet, sizeof(prtclMsgGet));
	if (ret != sizeof(QcPrtclMsgGet)){
		qc_seterr(err, QC_ERR_SOCKET, "tcp send body failed.");
		goto failed;
	}

	//receive
	ret = qc_tcp_recvall(socket, (char*)&prtclHead, sizeof(QcPrtclHead));
	if (ret <= 0){
		qc_seterr(err, QC_ERR_SOCKET, "tcp recv head failed.");
		goto failed;
	}
	qc_prtcl_head_ntoh(&prtclHead);

	QcPrtclReply prtclReply;
	ret = qc_tcp_recvall(socket, (char*)&prtclReply, sizeof(QcPrtclReply));
	if (ret <= 0){
		qc_seterr(err, QC_ERR_SOCKET, "tcp recv relpy failed.");
		goto failed;
	}
	qc_prtcl_reply_ntoh(&prtclReply);

	if (prtclReply.result == QC_RESULT_SUCC){
		char *buff;
		qc_malloc(buff, prtclReply.msg_len+1);

		int buff_len = prtclReply.msg_len;
		ret = qc_tcp_recvall(socket, buff, buff_len);
		if (ret <= 0){
			qc_seterr(err, QC_ERR_SOCKET, "tcp recv buff failed.");
			goto failed;
		}

		QcMessage *message = qc_message_create(buff, buff_len, 0);
		return message;

	}
	else if(prtclReply.result == QC_RESULT_TIMEOUT){
		qc_seterr(err, QC_ERR_TIMEOUT, "time out");
		goto failed;
	}
	else{
		qc_seterr(err, QC_ERR_UNKOWN, "unkown failed");
		goto failed;
	}

failed:
	return NULL;
}